

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void openjtalk_speakAsyncSjis(OpenJTalk *oj,char *text)

{
  OpenJTalk *in_RSI;
  long in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    openjtalk_stop((OpenJTalk *)0x19a15f);
    synthesisSjis(in_RSI,in_stack_ffffffffffffffe8);
    speakasync((OpenJTalk *)0x19a178);
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_speakAsyncSjis(OpenJTalk *oj, const char *text)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}
	openjtalk_stop(oj);
	synthesisSjis(oj, text);
	speakasync(oj);
}